

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopSnapshot(cmMakefile *this,bool reportError)

{
  bool bVar1;
  cmState *this_00;
  cmStateSnapshot local_68;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  cmMakefile *pcStack_10;
  bool reportError_local;
  cmMakefile *this_local;
  
  local_11 = reportError;
  pcStack_10 = this;
  while( true ) {
    bVar1 = cmStateSnapshot::CanPopPolicyScope(&this->StateSnapshot);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    if ((local_11 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"cmake_policy PUSH without matching POP",&local_39);
      IssueMessage(this,FATAL_ERROR,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      local_11 = 0;
    }
    PopPolicy(this);
  }
  this_00 = GetState(this);
  cmState::Pop(&local_68,this_00,&this->StateSnapshot);
  (this->StateSnapshot).State = local_68.State;
  (this->StateSnapshot).Position.Tree = local_68.Position.Tree;
  (this->StateSnapshot).Position.Position = local_68.Position.Position;
  bVar1 = cmStateSnapshot::IsValid(&this->StateSnapshot);
  if (!bVar1) {
    __assert_fail("this->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x1103,"void cmMakefile::PopSnapshot(bool)");
  }
  return;
}

Assistant:

void cmMakefile::PopSnapshot(bool reportError)
{
  // cmStateSnapshot manages nested policy scopes within it.
  // Since the scope corresponding to the snapshot is closing,
  // reject any still-open nested policy scopes with an error.
  while (!this->StateSnapshot.CanPopPolicyScope()) {
    if (reportError) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         "cmake_policy PUSH without matching POP");
      reportError = false;
    }
    this->PopPolicy();
  }

  this->StateSnapshot = this->GetState()->Pop(this->StateSnapshot);
  assert(this->StateSnapshot.IsValid());
}